

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O1

string * __thiscall
phosg::Subprocess::communicate_abi_cxx11_
          (string *__return_storage_ptr__,Subprocess *this,void *stdin_data,size_t stdin_size,
          uint64_t timeout_usecs)

{
  pointer pcVar1;
  size_t sVar2;
  _Elt_pointer pbVar3;
  bool bVar4;
  __pid_t _Var5;
  uint64_t uVar6;
  ulong uVar7;
  size_type sVar8;
  _Elt_pointer pbVar9;
  ssize_t sVar10;
  runtime_error *this_00;
  int __sig;
  nfds_t __nfds;
  size_t sVar11;
  _Map_pointer ppbVar12;
  int *__k;
  string *qi;
  ulong uVar13;
  _Elt_pointer pbVar14;
  Poll p;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stdout_queue;
  unordered_map<int,_short,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_short>_>_>
  events;
  size_type local_118;
  size_t local_110;
  Poll local_108;
  int *local_f0;
  size_t local_e8;
  void *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_e0 = stdin_data;
  if (timeout_usecs == 0) {
    uVar13 = 0;
  }
  else {
    uVar6 = now();
    uVar13 = uVar6 + timeout_usecs;
  }
  local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (stdin_size == 0) {
    close(this->stdin_write_fd);
    this->stdin_write_fd = -1;
  }
  else {
    Poll::add(&local_108,this->stdin_write_fd,4);
  }
  Poll::add(&local_108,this->stdout_read_fd,1);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_e8 = stdin_size;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_b8,0);
  __k = &this->stdout_read_fd;
  local_118 = 0;
  local_110 = 0;
  local_f0 = __k;
  while( true ) {
    _Var5 = wait(this,(void *)0x1);
    if ((-1 < _Var5) || (uVar6 = now(), uVar13 <= uVar6)) goto LAB_0011c9bc;
    bVar4 = Poll::empty(&local_108);
    if (bVar4) break;
    uVar6 = now();
    __nfds = 0;
    uVar7 = uVar13 - uVar6;
    if (uVar6 <= uVar13 && uVar7 != 0) {
      uVar6 = 0x20c49ba5e353f7cf;
      __nfds = uVar7 / 1000;
    }
    Poll::poll((Poll *)&local_68,(pollfd *)&local_108,__nfds,(int)uVar6);
    sVar8 = ::std::
            _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_68,__k);
    if (sVar8 != 0) {
      read_abi_cxx11_((phosg *)&local_d8,*__k,(void *)0x1000,uVar6);
      ::std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 &local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      if (pbVar9[-1]._M_string_length == 0) {
        Poll::remove(&local_108,(char *)(ulong)(uint)*__k);
        *__k = 0xffffffff;
      }
      else {
        pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        local_118 = local_118 + pbVar9[-1]._M_string_length;
      }
    }
    sVar8 = ::std::
            _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_68,&this->stdin_write_fd);
    sVar2 = local_e8;
    sVar11 = local_110;
    if (sVar8 != 0) {
      sVar10 = write(this->stdin_write_fd,(void *)((long)local_e0 + local_110),local_e8 - local_110)
      ;
      sVar11 = sVar10 + local_110;
      if (sVar10 < 1) {
        sVar11 = local_110;
      }
      __k = local_f0;
      if (sVar10 < 1 || sVar10 + local_110 == sVar2) {
        Poll::remove(&local_108,(char *)(ulong)(uint)this->stdin_write_fd);
        this->stdin_write_fd = -1;
        __k = local_f0;
      }
    }
    std::
    _Hashtable<int,_std::pair<const_int,_short>,_std::allocator<std::pair<const_int,_short>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    local_110 = sVar11;
  }
  wait(this,(void *)0x0);
LAB_0011c9bc:
  uVar6 = now();
  if (uVar13 <= uVar6) {
    kill(this,9,__sig);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Subprocess::communicate timed out");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else if (((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
           ((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
           ((((ulong)((long)local_b8._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_b8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x10 == 1) {
    uVar13 = (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_b8._M_impl.super__Deque_impl_data._M_start._M_first >> 5;
    pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (0xf < uVar13) {
      uVar7 = uVar13 >> 4 | 0xf000000000000000;
      if (0 < (long)uVar13) {
        uVar7 = uVar13 >> 4;
      }
      pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_start._M_node[uVar7] +
               uVar13 + uVar7 * -0x10;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar9->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar9->_M_string_length);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (__return_storage_ptr__,local_118);
    pbVar3 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pbVar14 = local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar9 = local_b8._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar12 = local_b8._M_impl.super__Deque_impl_data._M_start._M_node;
    while (pbVar14 != pbVar3) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,(pbVar14->_M_dataplus)._M_p,pbVar14->_M_string_length);
      pbVar14 = pbVar14 + 1;
      if (pbVar14 == pbVar9) {
        pbVar14 = ppbVar12[1];
        ppbVar12 = ppbVar12 + 1;
        pbVar9 = pbVar14 + 0x10;
      }
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_b8);
  if ((pollfd)local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
              super__Vector_impl_data._M_start != (pollfd)0x0) {
    operator_delete(local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.poll_fds.super__Vector_base<pollfd,_std::allocator<pollfd>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

string Subprocess::communicate(
    const void* stdin_data, size_t stdin_size, uint64_t timeout_usecs) {
  uint64_t deadline_usecs = timeout_usecs ? (now() + timeout_usecs) : 0;
  Poll p;
  if (stdin_size == 0) {
    close(this->stdin_write_fd);
    this->stdin_write_fd = -1;
  } else {
    p.add(this->stdin_write_fd, POLLOUT);
  }
  p.add(this->stdout_read_fd, POLLIN);

  size_t stdin_offset = 0;
  size_t stdout_bytes = 0;
  deque<string> stdout_queue;
  while ((this->wait(true) < 0) && (now() < deadline_usecs)) {
    if (p.empty()) {
      this->wait();
      break;
    }

    int timeout_ms;
    if (deadline_usecs) {
      uint64_t t = now();
      if (t < deadline_usecs) {
        timeout_ms = (deadline_usecs - t) / 1000;
      } else {
        timeout_ms = 0;
      }
    } else {
      timeout_ms = -1;
    }
    auto events = p.poll(timeout_ms);

    if (events.count(this->stdout_read_fd)) {
      stdout_queue.emplace_back(read(this->stdout_read_fd, 4096));
      if (stdout_queue.back().empty()) {
        p.remove(this->stdout_read_fd, true);
        this->stdout_read_fd = -1;
      } else {
        stdout_bytes += stdout_queue.back().size();
      }
    }
    if (events.count(this->stdin_write_fd)) {
      size_t bytes_remaining = stdin_size - stdin_offset;
      ssize_t bytes_written = write(
          this->stdin_write_fd,
          reinterpret_cast<const uint8_t*>(stdin_data) + stdin_offset,
          bytes_remaining);

      bool should_close_stdin = false;
      if (bytes_written <= 0) {
        should_close_stdin = true;
      } else {
        stdin_offset += bytes_written;
        should_close_stdin = (stdin_offset == stdin_size);
      }

      if (should_close_stdin) {
        p.remove(this->stdin_write_fd, true);
        this->stdin_write_fd = -1;
      }
    }
  }

  if (now() >= deadline_usecs) {
    // TODO: we should be a bit more polite here - send SIGTERM, wait a few
    // seconds, then send SIGKILL
    this->kill(SIGKILL);
    throw runtime_error("Subprocess::communicate timed out");
  }

  if (stdout_queue.empty()) {
    return "";
  } else if (stdout_queue.size() == 1) {
    return stdout_queue[0];
  } else {
    string ret;
    ret.reserve(stdout_bytes);
    for (const string& qi : stdout_queue) {
      ret += qi;
    }
    return ret;
  }
}